

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdsSTR::to_str(gdsSTR *this)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  pointer pgVar4;
  pointer pgVar5;
  pointer pgVar6;
  pointer pgVar7;
  pointer pgVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GDS STR class:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Name: ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  BBox: ",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->bounding_box[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->bounding_box[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->bounding_box[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->bounding_box[3]);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  pgVar4 = (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
      super__Vector_impl_data._M_finish != pgVar4) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      gdsSREF::to_str(pgVar4 + uVar9);
      pgVar4 = (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pgVar4 >> 3) * -0x1111111111111111;
      bVar11 = uVar10 <= uVar9;
      lVar1 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  pgVar5 = (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
      super__Vector_impl_data._M_finish != pgVar5) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      gdsBOUNDARY::to_str(pgVar5 + uVar9);
      pgVar5 = (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pgVar5 >> 3) *
              0x4ec4ec4ec4ec4ec5;
      bVar11 = uVar10 <= uVar9;
      lVar1 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  pgVar6 = (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
      super__Vector_impl_data._M_finish != pgVar6) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      gdsPATH::to_str(pgVar6 + uVar9);
      pgVar6 = (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pgVar6 >> 4) * 0x6db6db6db6db6db7;
      bVar11 = uVar10 <= uVar9;
      lVar1 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  pgVar7 = (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
      super__Vector_impl_data._M_finish != pgVar7) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      gdsNODE::to_str(pgVar7 + uVar9);
      pgVar7 = (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pgVar7 >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar11 = uVar10 <= uVar9;
      lVar1 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  pgVar8 = (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
      super__Vector_impl_data._M_finish != pgVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      gdsTEXT::to_str(pgVar8 + uVar9);
      pgVar8 = (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pgVar8 >> 3) * -0xf0f0f0f0f0f0f0f;
      bVar11 = uVar10 <= uVar9;
      lVar1 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar11 && lVar1 != 0);
  }
  return;
}

Assistant:

void gdsSTR::to_str()
{
  cout << "GDS STR class:" << endl;

  cout << "  Name: " << this->name << endl;

  cout << "  BBox: " << bounding_box[0] << ", ";
  cout << bounding_box[1] << "; ";
  cout << bounding_box[2] << ", ";
  cout << bounding_box[3] << endl;

  for (unsigned int i = 0; i < this->SREF.size(); i++) {
    this->SREF[i].to_str();
  }

  for (unsigned int i = 0; i < this->BOUNDARY.size(); i++) {
    this->BOUNDARY[i].to_str();
  }

  for (unsigned int i = 0; i < this->PATH.size(); i++) {
    this->PATH[i].to_str();
  }

  for (unsigned int i = 0; i < this->NODE.size(); i++) {
    this->NODE[i].to_str();
  }

  for (unsigned int i = 0; i < this->TEXT.size(); i++) {
    this->TEXT[i].to_str();
  }
}